

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O3

pool_ptr<soul::heart::OutputDeclaration> __thiscall
soul::Module::findOutput(Module *this,string_view name)

{
  long *plVar1;
  bool bVar2;
  char *in_RCX;
  ProgramImpl *pPVar3;
  long *plVar4;
  string_view other;
  
  plVar4 = *(long **)(name._M_len + 0x88);
  plVar1 = *(long **)(name._M_len + 0x90);
  if (plVar4 == plVar1) {
    pPVar3 = (ProgramImpl *)0x0;
  }
  else {
    pPVar3 = (ProgramImpl *)0x0;
    do {
      other._M_str = in_RCX;
      other._M_len = (size_t)name._M_str;
      bVar2 = Identifier::operator==((Identifier *)(*plVar4 + 0x18),other);
      if (bVar2) {
        pPVar3 = (ProgramImpl *)*plVar4;
        break;
      }
      plVar4 = plVar4 + 1;
    } while (plVar4 != plVar1);
  }
  (this->program).pimpl = pPVar3;
  return (pool_ptr<soul::heart::OutputDeclaration>)(OutputDeclaration *)this;
}

Assistant:

pool_ptr<heart::OutputDeclaration> Module::findOutput (std::string_view name) const
{
    for (auto& f : outputs)
        if (f->name == name)
            return f;

    return {};
}